

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O0

void __thiscall
google::protobuf::io::CopyingOutputStreamAdaptor::~CopyingOutputStreamAdaptor
          (CopyingOutputStreamAdaptor *this)

{
  CopyingOutputStreamAdaptor *this_local;
  
  (this->super_ZeroCopyOutputStream)._vptr_ZeroCopyOutputStream =
       (_func_int **)&PTR__CopyingOutputStreamAdaptor_0039d180;
  WriteBuffer(this);
  if (((this->owns_copying_stream_ & 1U) != 0) &&
     (this->copying_stream_ != (CopyingOutputStream *)0x0)) {
    (*this->copying_stream_->_vptr_CopyingOutputStream[1])();
  }
  std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
            (&this->buffer_);
  ZeroCopyOutputStream::~ZeroCopyOutputStream(&this->super_ZeroCopyOutputStream);
  return;
}

Assistant:

CopyingOutputStreamAdaptor::~CopyingOutputStreamAdaptor() {
  WriteBuffer();
  if (owns_copying_stream_) {
    delete copying_stream_;
  }
}